

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O2

CharClass<char> * __thiscall
Centaurus::CharClass<char>::operator|=(CharClass<char> *this,Range<char> *r)

{
  Range<char> local_40;
  CharClass<char> local_30;
  
  local_40._vptr_Range = (_func_int **)&PTR__Range_0019f070;
  local_40.m_start = r->m_start;
  local_40.m_end = r->m_end;
  operator|(&local_30,this,&local_40);
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::_M_move_assign
            (&this->m_ranges,&local_30.m_ranges);
  ~CharClass(&local_30);
  return this;
}

Assistant:

CharClass<TCHAR>& operator|=(const Range<TCHAR>& r)
    {
        return *this = *this | r;
    }